

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

bool __thiscall DReachabilityPropagator::propagateRemNode(DReachabilityPropagator *this,int node)

{
  pointer piVar1;
  bool bVar2;
  int *remvd_edge;
  pointer __v;
  vector<int,_std::allocator<int>_> remvd_edges;
  
  remvd_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  remvd_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  remvd_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = GraphPropagator::coherence_outedges(&this->super_GraphPropagator,node,&remvd_edges);
  piVar1 = remvd_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (bVar2) {
    for (__v = remvd_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start; __v != piVar1; __v = __v + 1) {
      Tint::operator=(this->last_state_e + *__v,1);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->rem_edge,__v);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&remvd_edges.super__Vector_base<int,_std::allocator<int>_>);
  return bVar2;
}

Assistant:

bool DReachabilityPropagator::propagateRemNode(int node) {
	assert(getNodeVar(node).isFixed());
	assert(getNodeVar(node).isFalse());
	std::vector<int> remvd_edges;
	const bool ok = GraphPropagator::coherence_outedges(node, remvd_edges);
	if (!ok) {
		return false;
	}
	for (const int& remvd_edge : remvd_edges) {
		last_state_e[remvd_edge] = VT_OUT;
		rem_edge.insert(remvd_edge);
	}
	return true;
}